

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double __thiscall
despot::Parser::InitialWeight(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  size_type sVar1;
  const_reference pvVar2;
  uint *puVar3;
  double extraout_XMM0_Qa;
  int local_24;
  double dStack_20;
  int s;
  double prob;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  
  dStack_20 = 1.0;
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                      (&this->curr_state_vars_);
    if (sVar1 <= (ulong)(long)local_24) break;
    pvVar2 = std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::operator[]
                       (&this->initial_belief_funcs_,(long)local_24);
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_24);
    (*(pvVar2->super_CPT).super_Function._vptr_Function[4])(pvVar2,0,(ulong)*puVar3);
    dStack_20 = extraout_XMM0_Qa * dStack_20;
    local_24 = local_24 + 1;
  }
  return dStack_20;
}

Assistant:

double Parser::InitialWeight(const vector<int>& state) const {
	double prob = 1;
	for (int s = 0; s < curr_state_vars_.size(); s++) {
		prob *= initial_belief_funcs_[s].GetValue(0, state[s]);
	}
	return prob;
}